

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall PDA::Transducer::Generator::writeFunctions(Generator *this,wostream *stream)

{
  ulong uVar1;
  const_iterator cVar2;
  bool bVar3;
  uint uVar4;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *pvVar5;
  wostream *pwVar6;
  size_type sVar7;
  const_reference pvVar8;
  wchar_t suff;
  undefined8 in_RCX;
  wchar_t in_R8D;
  wstring local_2f8 [32];
  undefined1 local_2d8 [16];
  wstring local_2c8;
  Register local_2a8;
  undefined1 local_298 [16];
  wstring local_288;
  allocator<wchar_t> local_261;
  wstring local_260;
  wstring local_240;
  Register local_220;
  undefined1 local_210 [16];
  wstring local_200;
  ulong local_1e0;
  size_t i;
  wstring local_1d0;
  wstring local_1b0;
  Register local_190;
  wstring local_180;
  allocator<wchar_t> local_159;
  wstring local_158;
  wstring local_138;
  Register local_118;
  undefined1 local_108 [16];
  wstring local_f8;
  undefined1 local_d8 [16];
  wstring local_c8;
  wstring local_a8;
  allocator<wchar_t> local_71;
  wstring local_70;
  wstring local_50;
  reference local_30;
  Identifier *identifier;
  __normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
  local_20;
  const_iterator identifierIterator;
  wostream *stream_local;
  Generator *this_local;
  
  identifierIterator._M_current = (Identifier *)stream;
  pvVar5 = Tokenizer::identifiers(this->m_tokenizer);
  local_20._M_current =
       (Identifier *)
       std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>::begin
                 (pvVar5);
  while( true ) {
    pvVar5 = Tokenizer::identifiers(this->m_tokenizer);
    identifier = (Identifier *)
                 std::
                 vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>::
                 end(pvVar5);
    bVar3 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
                        *)&identifier);
    if (!bVar3) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
               ::operator*(&local_20);
    cVar2 = identifierIterator;
    suff = (wchar_t)in_RCX;
    if (local_30->type == Function) {
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_70,L"Function begin",&local_71);
      comment(&local_50,&local_70);
      pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)&local_50);
      std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring((wstring *)&local_50);
      std::__cxx11::wstring::~wstring((wstring *)&local_70);
      std::allocator<wchar_t>::~allocator(&local_71);
      cVar2 = identifierIterator;
      hash(&local_a8,&local_30->decoratedName);
      pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)&local_a8);
      pwVar6 = std::operator<<(pwVar6,L':');
      std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring((wstring *)&local_a8);
      cVar2 = identifierIterator;
      Register::Register((Register *)local_d8,0x51,Full);
      push_abi_cxx11_((wstring *)(local_d8 + 0x10),(Generator *)local_d8,(Register *)0x0,suff);
      pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)(local_d8 + 0x10));
      std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring((wstring *)(local_d8 + 0x10));
      cVar2 = identifierIterator;
      Register::Register((Register *)local_108,0x52,Full);
      Register::Register(&local_118,0x51,Full);
      mov_abi_cxx11_((wstring *)(local_108 + 0x10),(Generator *)local_108,&local_118,(Register *)0x0
                     ,in_R8D);
      pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)(local_108 + 0x10));
      std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring((wstring *)(local_108 + 0x10));
      cVar2 = identifierIterator;
      if (0 < local_30->rbpOffset) {
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  ((wstring *)&local_158,L"Space allocate for variables",&local_159);
        comment(&local_138,&local_158);
        pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)&local_138);
        std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
        std::__cxx11::wstring::~wstring((wstring *)&local_138);
        std::__cxx11::wstring::~wstring((wstring *)&local_158);
        std::allocator<wchar_t>::~allocator(&local_159);
        cVar2 = identifierIterator;
        uVar4 = Identifier::roundedRbpOffset(local_30);
        Register::Register(&local_190,0x52,Full);
        sub_abi_cxx11_(&local_180,(Generator *)(ulong)uVar4,(int)&local_190,(Register *)0x0,in_R8D);
        pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)&local_180);
        std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
        std::__cxx11::wstring::~wstring((wstring *)&local_180);
        cVar2 = identifierIterator;
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  ((wstring *)&local_1d0,L"Arguments copy from registers to variables",
                   (allocator<wchar_t> *)((long)&i + 7));
        comment(&local_1b0,&local_1d0);
        pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)&local_1b0);
        std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
        std::__cxx11::wstring::~wstring((wstring *)&local_1b0);
        std::__cxx11::wstring::~wstring((wstring *)&local_1d0);
        std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&i + 7));
        for (local_1e0 = 0; uVar1 = local_1e0,
            sVar7 = std::
                    vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                    ::size(&local_30->functionArgs), uVar1 < sVar7; local_1e0 = local_1e0 + 1) {
          pvVar8 = std::
                   vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                   ::operator[](&local_30->functionArgs,local_1e0);
          cVar2 = identifierIterator;
          if (pvVar8->type == Integer) {
            Register::Register((Register *)local_210,(unsigned_short)local_1e0,Half);
            pvVar8 = std::
                     vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                     ::operator[](&local_30->functionArgs,local_1e0);
            Register::Register(&local_220,0x51,Full,pvVar8->rbpOffset);
            mov_abi_cxx11_((wstring *)(local_210 + 0x10),(Generator *)local_210,&local_220,
                           (Register *)0x6c,in_R8D);
            pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)(local_210 + 0x10));
            std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
            std::__cxx11::wstring::~wstring((wstring *)(local_210 + 0x10));
          }
        }
      }
      cVar2._M_current = identifierIterator._M_current;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_260,L"Function body",&local_261);
      comment(&local_240,&local_260);
      pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)&local_240);
      std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring((wstring *)&local_240);
      std::__cxx11::wstring::~wstring((wstring *)&local_260);
      std::allocator<wchar_t>::~allocator(&local_261);
      writeFunctionBody(this,(wostream *)identifierIterator._M_current,(long)local_30->tokenIndex);
      cVar2 = identifierIterator;
      Register::Register((Register *)local_298,0x51,Full);
      Register::Register(&local_2a8,0x52,Full);
      in_RCX = 0;
      mov_abi_cxx11_((wstring *)(local_298 + 0x10),(Generator *)local_298,&local_2a8,(Register *)0x0
                     ,in_R8D);
      pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)(local_298 + 0x10));
      std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring((wstring *)(local_298 + 0x10));
      cVar2 = identifierIterator;
      Register::Register((Register *)local_2d8,0x51,Full);
      pop_abi_cxx11_((wstring *)(local_2d8 + 0x10),(Generator *)local_2d8,(Register *)0x0,
                     (wchar_t)in_RCX);
      pwVar6 = std::operator<<((wostream *)cVar2._M_current,(wstring *)(local_2d8 + 0x10));
      std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring((wstring *)(local_2d8 + 0x10));
      cVar2 = identifierIterator;
      ret_abi_cxx11_();
      pwVar6 = std::operator<<((wostream *)cVar2._M_current,local_2f8);
      std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
      std::__cxx11::wstring::~wstring(local_2f8);
    }
    __gnu_cxx::
    __normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Generator::writeFunctions(std::wostream &stream)
{
    for(std::vector<Identifier>::const_iterator identifierIterator = m_tokenizer.identifiers().begin(); identifierIterator != m_tokenizer.identifiers().end(); ++identifierIterator)
    {
        const Identifier &identifier = *identifierIterator;

        if (identifier.type == Identifier::Type::Function)
        {
            stream << comment(L"Function begin") << std::endl;
            stream << hash(identifier.decoratedName) << L':' << std::endl;
            stream << push(Register(Register::StackBase, Register::Size::Full)) << std::endl;
            stream << mov(Register(Register::StackTop, Register::Size::Full), Register(Register::StackBase, Register::Size::Full)) << std::endl;
            if (identifier.rbpOffset > 0)
            {
                stream << comment(L"Space allocate for variables") << std::endl;
                stream << sub( identifier.roundedRbpOffset() , Register(Register::StackTop, Register::Size::Full)) << std::endl;
                stream << comment(L"Arguments copy from registers to variables") << std::endl;
                // copying arguments
                for(size_t i = 0 ; i < identifier.functionArgs.size(); ++i)
                {
                    if (identifier.functionArgs[i].type == Identifier::Type::Integer)
                    {
                        stream << mov(Register(i, Register::Size::Half), Register(Register::StackBase, Register::Size::Full, identifier.functionArgs[i].rbpOffset), L'l') << std::endl;
                    }
                }
            }
            stream << comment(L"Function body") << std::endl;
            writeFunctionBody(stream, static_cast<size_t>(identifier.tokenIndex));
            // function end
            stream << mov(Register(Register::StackBase, Register::Size::Full), Register(Register::StackTop, Register::Size::Full)) << std::endl;
            stream << pop(Register(Register::StackBase, Register::Size::Full)) << std::endl;
            stream << ret() << std::endl;
        }
    }
}